

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

Response * jaegertracing::net::http::get(Response *__return_storage_ptr__,URI *uri)

{
  HandleType __fd;
  int iVar1;
  ostream *poVar2;
  void *__buf;
  size_t __n;
  ssize_t sVar3;
  system_error *this;
  int *piVar4;
  error_category *__ecat;
  socklen_t in_ECX;
  size_t __nbytes;
  string local_438;
  undefined1 local_418 [8];
  ostringstream oss;
  ssize_t numWritten;
  __string_type request;
  string local_258;
  undefined1 local_238 [8];
  ostringstream requestStream;
  Socket local_c0 [9];
  undefined1 local_28 [8];
  Socket socket;
  URI *uri_local;
  
  socket._8_8_ = uri;
  Socket::Socket((Socket *)local_28);
  Socket::open((Socket *)local_28,(char *)0x2,1);
  Socket::connect(local_c0,(int)local_28,(sockaddr *)socket._8_8_,in_ECX);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  poVar2 = std::operator<<((ostream *)local_238,"GET ");
  URI::target_abi_cxx11_(&local_258,(URI *)socket._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)&local_258);
  poVar2 = std::operator<<(poVar2," HTTP/1.1\r\n");
  poVar2 = std::operator<<(poVar2,"Host: ");
  URI::authority_abi_cxx11_((string *)((long)&request.field_2 + 8),(URI *)socket._8_8_);
  poVar2 = std::operator<<(poVar2,(string *)(request.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"\r\nUser-Agent: jaegertracing/");
  poVar2 = std::operator<<(poVar2,"C++-0.5.0");
  std::operator<<(poVar2,"\r\n\r\n");
  std::__cxx11::string::~string((string *)(request.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::ostringstream::str();
  __fd = Socket::handle((Socket *)local_28);
  __buf = (void *)std::__cxx11::string::c_str();
  __n = std::__cxx11::string::size();
  sVar3 = ::write(__fd,__buf,__n);
  iVar1 = std::__cxx11::string::size();
  if (sVar3 != iVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
    poVar2 = std::operator<<((ostream *)local_418,"Failed to write entire HTTP request");
    poVar2 = std::operator<<(poVar2,", uri=");
    poVar2 = ::operator<<(poVar2,(URI *)socket._8_8_);
    poVar2 = std::operator<<(poVar2,", request=");
    std::operator<<(poVar2,(string *)&numWritten);
    this = (system_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    __ecat = (error_category *)std::_V2::system_category();
    std::__cxx11::ostringstream::str();
    std::system_error::system_error(this,iVar1,__ecat,&local_438);
    __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  read((int)__return_storage_ptr__,local_28,__nbytes);
  std::__cxx11::string::~string((string *)&numWritten);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  Socket::~Socket((Socket *)local_28);
  return __return_storage_ptr__;
}

Assistant:

Response get(const URI& uri)
{
    Socket socket;
    socket.open(AF_INET, SOCK_STREAM);
    socket.connect(uri);
    std::ostringstream requestStream;
    requestStream << "GET " << uri.target() << " HTTP/1.1\r\n"
                  << "Host: " << uri.authority()
                  << "\r\n"
                     "User-Agent: jaegertracing/"
                  << kJaegerClientVersion << "\r\n\r\n";
    const auto request = requestStream.str();
#ifdef WIN32
    const auto numWritten = ::send(socket.handle(), request.c_str(), request.size(), 0);
#else
    const auto numWritten = ::write(socket.handle(), request.c_str(), request.size());
#endif
    if (numWritten != static_cast<int>(request.size())) {
        std::ostringstream oss;
        oss << "Failed to write entire HTTP request"
            << ", uri=" << uri << ", request=" << request;
        throw std::system_error(errno, std::system_category(), oss.str());
    }

  return read(socket);
}